

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this_00;
  pointer pcVar2;
  cmLocalGenerator *lg_00;
  cmGeneratorTarget *gtgt;
  bool bVar3;
  int iVar4;
  string *psVar5;
  pointer ppcVar6;
  RegularExpression *this_01;
  iterator iVar7;
  ostream *poVar8;
  char *pcVar9;
  _Base_ptr this_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar10;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string workString;
  string definesString;
  string includesString;
  string makefileName;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  char *local_388;
  undefined8 local_380;
  size_type local_378;
  pointer local_370;
  undefined8 local_368;
  undefined8 local_360;
  char *local_358;
  undefined8 local_350;
  size_type local_348;
  pointer local_340;
  undefined8 local_338;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_328;
  cmLocalGenerator *local_308;
  string local_300;
  string local_2e0;
  string local_2c0;
  cmExtraSublimeTextGenerator *local_2a0;
  string *local_298;
  cmGeneratedFileStream *local_290;
  char *local_288;
  _Base_ptr local_280;
  pointer local_278;
  cmGeneratorTarget *local_270;
  pointer local_268;
  undefined1 local_260 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240 [9];
  char *local_160;
  char *local_60;
  char *local_50;
  char *local_40;
  int local_38;
  
  local_308 = lg;
  local_288 = make;
  if (target != (cmGeneratorTarget *)0x0) {
    local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"CMAKE_BUILD_TYPE","");
    psVar5 = cmMakefile::GetSafeDefinition(makefile,(string *)local_260);
    cmGeneratorTarget::GetSourceFiles(target,&local_328,psVar5);
    local_2a0 = this;
    local_298 = targetName;
    local_290 = fout;
    local_270 = target;
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
    }
    gtgt = local_270;
    local_278 = local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_280 = &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header._M_header;
      ppcVar6 = local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = *ppcVar6;
        local_268 = ppcVar6;
        this_01 = (RegularExpression *)
                  cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
        if (iVar7._M_node == local_280) {
          psVar5 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
          local_3a8._M_dataplus._M_p = (char *)0x0;
          local_3a8._M_string_length = 0;
          local_3a8.field_2._M_allocated_capacity = 0;
          local_260._0_8_ = local_260 + 0x10;
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_260,pcVar2,pcVar2 + psVar5->_M_string_length);
          local_240[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3a8._M_dataplus._M_p;
          local_240[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3a8._M_string_length;
          local_240[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_3a8.field_2._M_allocated_capacity;
          local_3a8._M_dataplus._M_p = (char *)0x0;
          local_3a8._M_string_length = 0;
          local_3a8.field_2._M_allocated_capacity = 0;
          this_01 = (RegularExpression *)local_260;
          pVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                   ::
                   _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                               *)sourceFileFlags,
                              (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_260);
          iVar7._M_node = (_Base_ptr)pVar10.first._M_node;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_240);
          if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
            this_01 = (RegularExpression *)(CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
            operator_delete((void *)local_260._0_8_,(ulong)this_01);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3a8);
        }
        lg_00 = local_308;
        ComputeFlagsForObject_abi_cxx11_
                  (&local_3c8,(cmExtraSublimeTextGenerator *)this_01,this_00,local_308,gtgt);
        ComputeDefines_abi_cxx11_
                  (&local_2e0,(cmExtraSublimeTextGenerator *)this_01,this_00,lg_00,gtgt);
        ComputeIncludes_abi_cxx11_
                  (&local_2c0,(cmExtraSublimeTextGenerator *)this_01,this_00,lg_00,gtgt);
        this_02 = iVar7._M_node + 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_02,*(pointer *)this_02);
        local_50 = (char *)0x0;
        local_40 = (char *)0x0;
        local_38 = 0;
        memset((RegularExpression *)local_260,0,0x20a);
        cmsys::RegularExpression::compile
                  ((RegularExpression *)local_260,
                   "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
        local_3a8._M_dataplus._M_p = (pointer)local_3c8._M_string_length;
        local_3a8._M_string_length = (size_type)local_3c8._M_dataplus._M_p;
        local_3a8.field_2._M_allocated_capacity = 0;
        local_3a8.field_2._8_8_ = 1;
        local_388 = " ";
        local_380 = 0;
        local_378 = local_2e0._M_string_length;
        local_370 = local_2e0._M_dataplus._M_p;
        local_368 = 0;
        local_360 = 1;
        local_358 = " ";
        local_350 = 0;
        local_348 = local_2c0._M_string_length;
        local_340 = local_2c0._M_dataplus._M_p;
        local_338 = 0;
        views._M_len = 5;
        views._M_array = (iterator)&local_3a8;
        cmCatViews(&local_300,views);
        while (bVar3 = cmsys::RegularExpression::find
                                 ((RegularExpression *)local_260,local_300._M_dataplus._M_p,
                                  (RegularExpressionMatch *)local_260), bVar3) {
          std::__cxx11::string::substr((ulong)&local_3a8,(ulong)&local_300);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                     &local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          if ((ulong)((long)local_160 - (long)local_60) < local_300._M_string_length) {
            std::__cxx11::string::substr((ulong)&local_3a8,(ulong)&local_300);
            std::__cxx11::string::operator=((string *)&local_300,(string *)&local_3a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_300._M_string_length = 0;
            *local_300._M_dataplus._M_p = '\0';
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        ppcVar6 = local_268 + 1;
      } while (ppcVar6 != local_278);
    }
    this = local_2a0;
    fout = local_290;
    targetName = local_298;
    if (local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_328.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      this = local_2a0;
      fout = local_290;
      targetName = local_298;
    }
  }
  local_260._8_8_ = (char *)0x0;
  local_260[0x10] = '\0';
  local_260._0_8_ = local_260 + 0x10;
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_3a8);
  iVar4 = std::__cxx11::string::compare((char *)&local_3a8);
  paVar1 = &local_3a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  pcVar9 = "Makefile";
  if (iVar4 == 0) {
    pcVar9 = "build.ninja";
  }
  std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)local_260._8_8_,(ulong)pcVar9);
  if (!firstTarget) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,",\n\t",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t{\n\t\t\t\"name\": \"",0xf);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_3a8,local_308);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(targetName->_M_dataplus)._M_p,targetName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\",\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\"cmd\": [",0xb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,local_288,(allocator<char> *)&local_2e0);
  BuildMakeCommand(&local_3a8,this,&local_3c8,(string *)local_260,targetName);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_3a8._M_dataplus._M_p,local_3a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"],\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
             ,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      auto sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->ResolveFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(
              sourceFile->ResolveFullPath(), std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        R"((^|[ ])-[DIOUWfgs][^= ]+(=\"[^"]+\"|=[^"][^ ]+)?)";
      flagRegex.compile(regexString);
      std::string workString =
        cmStrCat(flagsString, " ", definesString, " ", includesString);
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName, targetName) << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}